

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O3

void yang_print_extcomplex_bool
               (lyout *out,int level,lys_module *module,lys_ext_instance_complex *ext,LY_STMT stmt,
               char *true_val,char *false_val,int *content)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  LY_ERR *pLVar4;
  lyext_substmt *local_48;
  lyext_substmt *info;
  lys_module *local_38;
  
  info = (lyext_substmt *)true_val;
  local_38 = module;
  pcVar3 = (char *)lys_ext_complex_get_substmt(stmt,ext,&local_48);
  if ((pcVar3 != (char *)0x0) && (cVar2 = *pcVar3, cVar2 != '\0')) {
    if ((content != (int *)0x0) && (*content == 0)) {
      *content = 1;
      ly_print(out," {\n");
      cVar2 = *pcVar3;
    }
    if (cVar2 == '\x02') {
      bVar1 = ext->ext_size;
    }
    else {
      if (cVar2 != '\x01') {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_yang.c"
               ,0x717);
        return;
      }
      bVar1 = ext->ext_size;
      false_val = (char *)info;
    }
    yang_print_substmt(out,level,stmt,'\0',false_val,local_38,ext->ext,(uint)bVar1);
  }
  return;
}

Assistant:

static void
yang_print_extcomplex_bool(struct lyout *out, int level, const struct lys_module *module,
                           struct lys_ext_instance_complex *ext, LY_STMT stmt,
                           const char *true_val, const char *false_val, int *content)
{
    struct lyext_substmt *info;
    uint8_t *val;

    val = lys_ext_complex_get_substmt(stmt, ext, &info);
    if (!val || !(*val)) {
        return;
    }

    yang_print_open(out, content);
    if (*val == 1) {
        yang_print_substmt(out, level, (LYEXT_SUBSTMT)stmt, 0, true_val, module, ext->ext, ext->ext_size);
    } else if (*val == 2) {
        yang_print_substmt(out, level, (LYEXT_SUBSTMT)stmt, 0, false_val, module, ext->ext, ext->ext_size);
    } else {
        LOGINT;
    }
}